

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O2

void __thiscall
modified_public_keycase::_impl<picnic_params_t>
          (modified_public_keycase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  context_frame context_frame_1980;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  size_t signature_len;
  value_expr<int> local_1bc;
  assertion_result local_1b8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_188;
  picnic_publickey_t pk;
  const_string local_138;
  char *local_128;
  char *local_120;
  const_string local_118;
  const_string local_108;
  const_string local_f8;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  picnic_privatekey_t sk;
  
  pk.data[8] = '\0';
  pk.data._0_8_ = &PTR__lazy_ostream_00180480;
  pk.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  pk.data._24_8_ = anon_var_dwarf_893fa;
  local_1a0._0_8_ = picnic_get_param_name(*parameters);
  sk.data._16_8_ = &pk;
  sk.data[8] = '\0';
  sk.data._0_8_ = &PTR__lazy_ostream_00182790;
  sk.data._24_8_ = local_1a0;
  boost::test_tools::tt_detail::context_frame::context_frame
            (&context_frame_1980,(lazy_ostream *)&sk);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&context_frame_1980);
  if (bVar1) {
    max_signature_size = picnic_signature_size(*parameters);
    local_a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_b8.m_begin = "";
    local_a8.m_end = "";
    local_b8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,200,&local_b8);
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&max_signature_size;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              ((assertion_result *)&pk,(value_expr<const_unsigned_long_&> *)&signature,false);
    local_1a0._0_8_ = "max_signature_size";
    local_c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    sk.data[8] = '\0';
    local_c8.m_end = "";
    local_1a0._8_8_ = "";
    sk.data._0_8_ = &PTR__lazy_ostream_001827d0;
    sk.data._16_8_ = boost::unit_test::lazy_ostream::inst;
    sk.data._24_8_ = local_1a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&pk,(lazy_ostream *)&sk,&local_c8,200,CHECK,CHECK_BUILT_ASSERTION
               ,0);
    boost::detail::shared_count::~shared_count((shared_count *)(pk.data + 0x10));
    local_d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_e8.m_begin = "";
    local_d8.m_end = "";
    local_e8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0xcc,&local_e8);
    iVar2 = picnic_keygen(*parameters,&pk,&sk);
    local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)&signature,(value_expr<bool> *)&local_1b8,false);
    local_188 = &message;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!picnic_keygen(parameters, &pk, &sk)";
    local_f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
    local_f8.m_end = "";
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_1a0._0_8_ = &PTR__lazy_ostream_001827d0;
    local_190 = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&signature,(lazy_ostream *)local_1a0,&local_f8,0xcc,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&signature,max_signature_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&message,0x200);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&message);
    for (lVar4 = -1; lVar4 != -0xf; lVar4 = lVar4 + -1) {
      lVar3 = picnic_get_private_key_size(*parameters);
      sk.data[lVar4 + lVar3] = ~sk.data[lVar4 + lVar3];
    }
    local_108.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_118.m_begin = "";
    local_108.m_end = "";
    local_118.m_end = "";
    signature_len = max_signature_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0xdb,&local_118);
    local_1bc.m_value =
         picnic_sign(&sk,message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,0x200,
                     signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&signature_len);
    boost::test_tools::assertion::value_expr<int>::evaluate(&local_1b8,&local_1bc,false);
    local_188 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128;
    local_128 = "picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)";
    local_138.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
    local_138.m_end = "";
    local_120 = "";
    local_1a0._0_8_ = &PTR__lazy_ostream_001827d0;
    local_190 = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b8,(lazy_ostream *)local_1a0,&local_138,0xdb,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_1980);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_public_key, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    for (size_t offset = 1; offset != 15; ++offset) {
      sk.data[picnic_get_private_key_size(parameters) - offset] ^= 0xff;
    }

    size_t signature_len = max_signature_size;
    BOOST_TEST(picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
  }
}